

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lspdf.cc
# Opt level: O2

int main(int argc,char **argv)

{
  FilterGainType gain_type;
  char *pcVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  ifstream *input_stream;
  char *pcVar9;
  allocator local_735;
  int interpolation_period;
  int frame_period;
  int num_filter_order;
  string local_728;
  char **local_708;
  ulong local_700;
  double signal;
  LineSpectralPairsDigitalFilter filter;
  Buffer buffer;
  vector<double,_std::allocator<double>_> filter_coefficients;
  int tmp;
  InputSourcePreprocessingForFilterGain preprocessing;
  ifstream ifs2;
  byte abStack_4c0 [488];
  InputSourceInterpolation interpolation;
  ifstream ifs1;
  byte abStack_238 [488];
  InputSourceFromStream input_source;
  
  num_filter_order = 0x19;
  frame_period = 100;
  interpolation_period = 1;
  local_700 = 0;
  local_708 = argv;
LAB_0010364d:
  do {
    iVar6 = ya_getopt_long(argc,local_708,"m:p:i:k:h",(option *)0x0,(int *)0x0);
    switch(iVar6) {
    case 0x68:
      anon_unknown.dwarf_2afb::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&interpolation_period);
      bVar3 = interpolation_period < 0;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar4 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        poVar7 = std::operator<<((ostream *)&ifs1,"The argument for the -i option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&ifs2,"lspdf",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00103981;
      }
      break;
    case 0x6b:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&tmp);
      if (bVar4) {
        bVar4 = sptk::IsInRange(tmp,0,2);
        std::__cxx11::string::~string((string *)&ifs1);
        if (bVar4) {
          local_700 = (ulong)(uint)tmp;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      poVar7 = std::operator<<((ostream *)&ifs1,"The argument for the -k option must be an integer "
                              );
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<((ostream *)poVar7,2);
      std::__cxx11::string::string((string *)&ifs2,"lspdf",(allocator *)&interpolation);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      goto LAB_00103981;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&num_filter_order);
      bVar3 = num_filter_order < 0;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar4 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        poVar7 = std::operator<<((ostream *)&ifs1,"The argument for the -m option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&ifs2,"lspdf",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00103981;
      }
      break;
    case 0x70:
      goto switchD_0010367b_caseD_70;
    default:
      if (iVar6 == -1) {
        if (frame_period / 2 < interpolation_period) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
          poVar7 = std::operator<<((ostream *)&ifs1,
                                   "Interpolation period must be equal to or less than half ");
          std::operator<<(poVar7,"frame period");
          std::__cxx11::string::string((string *)&ifs2,"lspdf",(allocator *)&tmp);
          sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
          goto LAB_00103981;
        }
        lVar8 = (long)argc;
        if (argc - ya_optind == 1) {
          lVar2 = lVar8 + -1;
          pcVar9 = (char *)0x0;
        }
        else {
          if (argc - ya_optind != 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
            std::operator<<((ostream *)&ifs1,"Just two input files, wfile and infile, are required")
            ;
            std::__cxx11::string::string((string *)&ifs2,"lspdf",(allocator *)&tmp);
            sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
            goto LAB_00103981;
          }
          lVar2 = lVar8 + -2;
          pcVar9 = local_708[lVar8 + -1];
        }
        pcVar1 = local_708[lVar2];
        bVar4 = sptk::SetBinaryMode();
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
          std::operator<<((ostream *)&ifs1,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&ifs2,"lspdf",(allocator *)&tmp);
          sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
          goto LAB_00103981;
        }
        std::ifstream::ifstream(&ifs1);
        std::ifstream::open((char *)&ifs1,(_Ios_Openmode)pcVar1);
        if ((abStack_238[*(long *)(_ifs1 + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs2);
          poVar7 = std::operator<<((ostream *)&ifs2,"Cannot open file ");
          std::operator<<(poVar7,pcVar1);
          std::__cxx11::string::string((string *)&tmp,"lspdf",(allocator *)&interpolation);
          sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs2);
          std::__cxx11::string::~string((string *)&tmp);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs2);
          iVar6 = 1;
          goto LAB_00104011;
        }
        input_stream = &ifs2;
        std::ifstream::ifstream(input_stream);
        if ((pcVar9 == (char *)0x0) ||
           (std::ifstream::open((char *)&ifs2,(_Ios_Openmode)pcVar9),
           (abStack_4c0[*(long *)(_ifs2 + -0x18)] & 5) == 0)) {
          cVar5 = std::__basic_file<char>::is_open();
          if (cVar5 == '\0') {
            input_stream = (ifstream *)&std::cin;
          }
          if ((uint)local_700 < 3) {
            gain_type = *(FilterGainType *)(&DAT_0010c028 + (local_700 & 0xffffffff) * 4);
            lVar8 = (long)num_filter_order;
            std::vector<double,_std::allocator<double>_>::vector
                      (&filter_coefficients,lVar8 + 1U,(allocator_type *)&tmp);
            sptk::InputSourceFromStream::InputSourceFromStream
                      (&input_source,false,(int)(lVar8 + 1U),(istream *)&ifs1);
            iVar6 = 1;
            sptk::InputSourceInterpolation::InputSourceInterpolation
                      (&interpolation,frame_period,interpolation_period,true,
                       &input_source.super_InputSourceInterface);
            sptk::InputSourcePreprocessingForFilterGain::InputSourcePreprocessingForFilterGain
                      (&preprocessing,gain_type,&interpolation.super_InputSourceInterface);
            if (preprocessing.is_valid_ == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
              std::operator<<((ostream *)&tmp,"Failed to initialize InputSource");
              std::__cxx11::string::string((string *)&buffer,"lspdf",(allocator *)&local_728);
              sptk::PrintErrorMessage((string *)&buffer,(ostringstream *)&tmp);
              std::__cxx11::string::~string((string *)&buffer);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
              goto LAB_00103fea;
            }
            sptk::LineSpectralPairsDigitalFilter::LineSpectralPairsDigitalFilter
                      (&filter,num_filter_order);
            buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00111ba0;
            buffer.d1_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            buffer.d1_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            buffer.d1_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            buffer.d2_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            buffer.ab_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            buffer.d2_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            buffer.d2_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            buffer.ab_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            buffer.ab_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            if (filter.is_valid_ != false) {
              goto LAB_00103dcd;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
            std::operator<<((ostream *)&tmp,"Failed to initialize LineSpectralPairsDigitalFilter");
            std::__cxx11::string::string((string *)&local_728,"lspdf",(allocator *)&signal);
            sptk::PrintErrorMessage(&local_728,(ostringstream *)&tmp);
            goto LAB_00103fc6;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
          poVar7 = std::operator<<((ostream *)&tmp,"Cannot open file ");
          std::operator<<(poVar7,pcVar9);
          std::__cxx11::string::string((string *)&interpolation,"lspdf",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&interpolation,(ostringstream *)&tmp);
          std::__cxx11::string::~string((string *)&interpolation);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
        }
        iVar6 = 1;
        goto LAB_00104004;
      }
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
      anon_unknown.dwarf_2afb::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
  } while( true );
switchD_0010367b_caseD_70:
  std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
  bVar3 = sptk::ConvertStringToInteger((string *)&ifs1,&frame_period);
  bVar4 = frame_period < 1;
  std::__cxx11::string::~string((string *)&ifs1);
  if (!bVar3 || bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    std::operator<<((ostream *)&ifs1,"The argument for the -p option must be a positive integer");
    std::__cxx11::string::string((string *)&ifs2,"lspdf",(allocator *)&tmp);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
LAB_00103981:
    std::__cxx11::string::~string((string *)&ifs2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs1);
    return 1;
  }
  goto LAB_0010364d;
  while( true ) {
    bVar4 = sptk::LineSpectralPairsDigitalFilter::Run(&filter,&filter_coefficients,&signal,&buffer);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      std::operator<<((ostream *)&tmp,"Failed to apply line spectral pairs digital filter");
      std::__cxx11::string::string((string *)&local_728,"lspdf",&local_735);
      sptk::PrintErrorMessage(&local_728,(ostringstream *)&tmp);
      goto LAB_00103fc6;
    }
    bVar4 = sptk::WriteStream<double>(signal,(ostream *)&std::cout);
    if (!bVar4) break;
LAB_00103dcd:
    bVar4 = sptk::ReadStream<double>(&signal,(istream *)input_stream);
    if (!bVar4) {
      iVar6 = 0;
      goto LAB_00103fe0;
    }
    bVar4 = sptk::InputSourcePreprocessingForFilterGain::Get
                      (&preprocessing,
                       (vector<double,_std::allocator<double>_> *)&filter_coefficients);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      std::operator<<((ostream *)&tmp,"Cannot get filter coefficients");
      std::__cxx11::string::string((string *)&local_728,"lspdf",&local_735);
      sptk::PrintErrorMessage(&local_728,(ostringstream *)&tmp);
      goto LAB_00103fc6;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
  std::operator<<((ostream *)&tmp,"Failed to write a filter output");
  std::__cxx11::string::string((string *)&local_728,"lspdf",&local_735);
  sptk::PrintErrorMessage(&local_728,(ostringstream *)&tmp);
LAB_00103fc6:
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
  iVar6 = 1;
LAB_00103fe0:
  sptk::LineSpectralPairsDigitalFilter::Buffer::~Buffer(&buffer);
LAB_00103fea:
  sptk::InputSourceInterpolation::~InputSourceInterpolation(&interpolation);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&filter_coefficients.super__Vector_base<double,_std::allocator<double>_>);
LAB_00104004:
  std::ifstream::~ifstream(&ifs2);
LAB_00104011:
  std::ifstream::~ifstream(&ifs1);
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  LocalGainType local_gain_type(kDefaultGainType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:p:i:k:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        const int min(0);
        const int max(static_cast<int>(kNumGainTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -k option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        local_gain_type = static_cast<LocalGainType>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, wfile and infile, are required";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  sptk::InputSourcePreprocessingForFilterGain::FilterGainType gain_type;
  switch (local_gain_type) {
    case kLinear: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kLinear;
      break;
    }
    case kLog: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kLog;
      break;
    }
    case kUnity: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kUnity;
      break;
    }
    default: {
      return 1;
    }
  }

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &input_source);
  sptk::InputSourcePreprocessingForFilterGain preprocessing(gain_type,
                                                            &interpolation);
  if (!preprocessing.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  sptk::LineSpectralPairsDigitalFilter filter(num_filter_order);
  sptk::LineSpectralPairsDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LineSpectralPairsDigitalFilter";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!preprocessing.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply line spectral pairs digital filter";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }
  }

  return 0;
}